

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

string * __thiscall antlr::InputBuffer::getLAChars_abi_cxx11_(InputBuffer *this)

{
  CircularQueue<int> *this_00;
  CircularQueue<int> *pCVar1;
  long in_RSI;
  string *in_RDI;
  uint i;
  string *ret;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 local_18;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_18 = *(uint *)(in_RSI + 0xc);
  while( true ) {
    this_00 = (CircularQueue<int> *)(ulong)local_18;
    pCVar1 = (CircularQueue<int> *)CircularQueue<int>::entries(this_00);
    if (pCVar1 <= this_00) break;
    in_stack_ffffffffffffffac =
         CircularQueue<int>::elementAt
                   (this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::__cxx11::string::operator+=((string *)in_RDI,(char)in_stack_ffffffffffffffac);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

string InputBuffer::getLAChars( void ) const
{
	ANTLR_USE_NAMESPACE(std)string ret;

	for(unsigned int i = markerOffset; i < queue.entries(); i++)
		ret += queue.elementAt(i);

	return ret;
}